

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_gentm.cc
# Opt level: O3

ASN1_GENERALIZEDTIME *
ASN1_GENERALIZEDTIME_adj(ASN1_GENERALIZEDTIME *s,time_t t,int offset_day,long offset_sec)

{
  int iVar1;
  ASN1_GENERALIZEDTIME *str;
  size_t sVar2;
  tm data;
  char buf [16];
  
  iVar1 = OPENSSL_posix_to_tm(t,&data);
  if ((iVar1 != 0) &&
     ((offset_day == 0 && offset_sec == 0 ||
      (iVar1 = OPENSSL_gmtime_adj(&data,offset_day,offset_sec), iVar1 != 0)))) {
    if (data.tm_year - 0x1fa4U < 0xffffd8f0) {
      ERR_put_error(0xc,0,0x8a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_gentm.cc"
                    ,0x51);
      return (ASN1_GENERALIZEDTIME *)0x0;
    }
    iVar1 = snprintf(buf,0x10,"%04d%02d%02d%02d%02d%02dZ",(ulong)(data.tm_year + 0x76c),
                     (ulong)(data.tm_mon + 1),(ulong)(uint)data.tm_mday,(ulong)(uint)data.tm_hour,
                     (ulong)(uint)data.tm_min,(ulong)(uint)data.tm_sec);
    if (iVar1 != 0xf) {
      abort();
    }
    str = s;
    if ((s != (ASN1_GENERALIZEDTIME *)0x0) || (str = ASN1_UTCTIME_new(), str != (ASN1_UTCTIME *)0x0)
       ) {
      sVar2 = strlen(buf);
      iVar1 = ASN1_STRING_set(str,buf,(int)sVar2);
      if (iVar1 != 0) {
        str->type = 0x18;
        return str;
      }
      if (s == (ASN1_GENERALIZEDTIME *)0x0) {
        ASN1_UTCTIME_free(str);
      }
    }
  }
  return (ASN1_GENERALIZEDTIME *)0x0;
}

Assistant:

ASN1_GENERALIZEDTIME *ASN1_GENERALIZEDTIME_adj(ASN1_GENERALIZEDTIME *s,
                                               int64_t posix_time,
                                               int offset_day,
                                               long offset_sec) {
  struct tm data;
  if (!OPENSSL_posix_to_tm(posix_time, &data)) {
    return NULL;
  }

  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&data, offset_day, offset_sec)) {
      return NULL;
    }
  }

  if (data.tm_year < 0 - 1900 || data.tm_year > 9999 - 1900) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TIME_VALUE);
    return NULL;
  }

  char buf[16];
  int ret = snprintf(buf, sizeof(buf), "%04d%02d%02d%02d%02d%02dZ",
                     data.tm_year + 1900, data.tm_mon + 1, data.tm_mday,
                     data.tm_hour, data.tm_min, data.tm_sec);
  // |snprintf| must write exactly 15 bytes (plus the NUL) to the buffer.
  BSSL_CHECK(ret == static_cast<int>(sizeof(buf) - 1));

  int free_s = 0;
  if (s == NULL) {
    free_s = 1;
    s = ASN1_UTCTIME_new();
    if (s == NULL) {
      return NULL;
    }
  }

  if (!ASN1_STRING_set(s, buf, strlen(buf))) {
    if (free_s) {
      ASN1_UTCTIME_free(s);
    }
    return NULL;
  }
  s->type = V_ASN1_GENERALIZEDTIME;
  return s;
}